

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_string.c
# Opt level: O1

int main(void)

{
  int iVar1;
  
  item[0].valuedouble = 0.0;
  item[0].string = (char *)0x0;
  item[0].valuestring = (char *)0x0;
  item[0].valueint = 0;
  item[0]._44_4_ = 0;
  item[0].child = (cJSON *)0x0;
  item[0].type = 0;
  item[0]._28_4_ = 0;
  item[0].next = (cJSON *)0x0;
  item[0].prev = (cJSON *)0x0;
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/deps/cJSON/tests/parse_string.c"
            );
  UnityDefaultTestRun(parse_string_should_parse_strings,"parse_string_should_parse_strings",0x80);
  UnityDefaultTestRun(parse_string_should_parse_utf16_surrogate_pairs,
                      "parse_string_should_parse_utf16_surrogate_pairs",0x81);
  UnityDefaultTestRun(parse_string_should_not_parse_non_strings,
                      "parse_string_should_not_parse_non_strings",0x82);
  UnityDefaultTestRun(parse_string_should_not_parse_invalid_backslash,
                      "parse_string_should_not_parse_invalid_backslash",0x83);
  UnityDefaultTestRun(parse_string_should_parse_bug_94,"parse_string_should_parse_bug_94",0x84);
  UnityDefaultTestRun(parse_string_should_not_overflow_with_closing_backslash,
                      "parse_string_should_not_overflow_with_closing_backslash",0x85);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    /* initialize cJSON item and error pointer */
    memset(item, 0, sizeof(cJSON));

    UNITY_BEGIN();
    RUN_TEST(parse_string_should_parse_strings);
    RUN_TEST(parse_string_should_parse_utf16_surrogate_pairs);
    RUN_TEST(parse_string_should_not_parse_non_strings);
    RUN_TEST(parse_string_should_not_parse_invalid_backslash);
    RUN_TEST(parse_string_should_parse_bug_94);
    RUN_TEST(parse_string_should_not_overflow_with_closing_backslash);
    return UNITY_END();
}